

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert.cpp
# Opt level: O3

string * __thiscall
libtorrent::session_stats_alert::message_abi_cxx11_
          (string *__return_storage_ptr__,session_stats_alert *this)

{
  size_t sVar1;
  char *__format;
  long lVar2;
  char msg [50];
  char acStack_68 [56];
  
  snprintf(acStack_68,0x32,"session stats (%d values): ",299);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  sVar1 = strlen(acStack_68);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,acStack_68,acStack_68 + sVar1);
  lVar2 = 0x10;
  __format = "%ld";
  do {
    snprintf(acStack_68,0x32,__format,*(undefined8 *)((long)(this->values)._M_elems + lVar2 + -0x10)
            );
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    lVar2 = lVar2 + 8;
    __format = ", %ld";
  } while (lVar2 != 0x968);
  return __return_storage_ptr__;
}

Assistant:

std::string session_stats_alert::message() const
	{
		char msg[50];
		auto cnt = counters();
		std::snprintf(msg, sizeof(msg), "session stats (%d values): " , int(cnt.size()));
		std::string ret = msg;
		bool first = true;
		for (auto v : cnt)
		{
			std::snprintf(msg, sizeof(msg), first ? "%" PRId64 : ", %" PRId64, v);
			first = false;
			ret += msg;
		}
		return ret;
	}